

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLNode::InsertChildPreamble(XMLNode *this,XMLNode *insertThis)

{
  if (insertThis->_parent != (XMLNode *)0x0) {
    Unlink(insertThis->_parent,insertThis);
    return;
  }
  XMLDocument::MarkInUse(insertThis->_document,insertThis);
  (*insertThis->_memPool->_vptr_MemPool[5])();
  return;
}

Assistant:

void XMLNode::InsertChildPreamble(XMLNode* insertThis) const
{
    TIXMLASSERT(insertThis);
    TIXMLASSERT(insertThis->_document == _document);

    if (insertThis->_parent) {
        insertThis->_parent->Unlink(insertThis);
    } else {
        insertThis->_document->MarkInUse(insertThis);
        insertThis->_memPool->SetTracked();
    }
}